

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O1

Fl_Menu_Item * __thiscall
Fl_Menu_Item::pulldown
          (Fl_Menu_Item *this,int X,int Y,int W,int H,Fl_Menu_Item *initial_item,Fl_Menu_ *pbutton,
          Fl_Menu_Item *t,int menubar)

{
  menutitle *pmVar1;
  int X_00;
  int Y_00;
  menustate *pmVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Fl_Window *pFVar7;
  menuwindow *this_00;
  Fl_Menu_Item *pFVar8;
  menuwindow *pmVar9;
  Fl_Menu_Item *pFVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  menuwindow *this_01;
  int iVar14;
  int iVar15;
  int iVar16;
  bool bVar17;
  int in_stack_fffffffffffffd88;
  int waY;
  int waX;
  Fl_Menu_Item *local_230;
  menustate pp;
  int waH;
  int waW;
  menuwindow mw;
  
  Fl_Group::current((Fl_Group *)0x0);
  button = pbutton;
  if ((pbutton == (Fl_Menu_ *)0x0) ||
     (pFVar7 = Fl_Widget::window(&pbutton->super_Fl_Widget), pFVar7 == (Fl_Window *)0x0)) {
    X = (X + Fl::e_x_root) - Fl::e_x;
    Y = (Y + Fl::e_y_root) - Fl::e_y;
  }
  else {
    while (pbutton = (Fl_Menu_ *)Fl_Widget::window(&pbutton->super_Fl_Widget),
          (Fl_Window *)pbutton != (Fl_Window *)0x0) {
      X = X + (((Fl_Window *)pbutton)->super_Fl_Group).super_Fl_Widget.x_;
      Y = Y + (((Fl_Window *)pbutton)->super_Fl_Group).super_Fl_Widget.y_;
    }
  }
  menuwindow::menuwindow(&mw,this,X,Y,W,H,initial_item,t,menubar,0,in_stack_fffffffffffffd88);
  this_01 = &mw;
  Fl::grab((Fl_Window *)&mw);
  ::p = &pp;
  pp.p[0] = &mw;
  pp.nummenus = 1;
  pp.menubar = menubar;
  pp.state = 0;
  pp.fakemenu = (menuwindow *)0x0;
  if (mw.selected < 0 || initial_item == (Fl_Menu_Item *)0x0) {
    pp.current_item = (Fl_Menu_Item *)0x0;
    pp.menu_number = 0;
    pp.item_number = -1;
    if (menubar != 0) {
      this_01 = &mw;
      iVar5 = menuwindow::handle(this_01,5);
      if (iVar5 == 0) {
        pFVar10 = (Fl_Menu_Item *)0x0;
        Fl::grab((Fl_Window *)0x0);
LAB_001bf708:
        menuwindow::~menuwindow(&mw);
        return pFVar10;
      }
    }
    initial_item = pp.current_item;
    if (pp.current_item == (Fl_Menu_Item *)0x0) goto LAB_001bf5ca;
  }
  else {
    pp.current_item = next(mw.menu,mw.selected);
    pp.menu_number = 0;
    pp.item_number = mw.selected;
    this_01 = (menuwindow *)mw.menu;
  }
  do {
    pFVar10 = pp.current_item;
    pmVar9 = pp.p[pp.menu_number];
    if (((pp.current_item)->flags & 0x11) == 0) {
      if (pmVar9->selected != pp.item_number) {
        pmVar9->selected = pp.item_number;
        this_01 = pmVar9;
        Fl_Widget::damage((Fl_Widget *)pmVar9,'\x01');
      }
      if (pFVar10 == initial_item) {
        initial_item = (Fl_Menu_Item *)0x0;
      }
      if ((pFVar10->flags & 0x60U) == 0) {
        while (iVar5 = pp.nummenus, pp.menu_number + 1 < pp.nummenus) {
          pp.nummenus = pp.nummenus + -1;
          this_01 = pp.p[(long)iVar5 + -1];
          if (this_01 != (menuwindow *)0x0) {
            (*(this_01->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
              super_Fl_Widget._vptr_Fl_Widget[1])();
          }
        }
        bVar17 = false;
        if ((pp.menu_number == 0) && (pp.menubar != 0)) {
          this_00 = (menuwindow *)operator_new(0x118);
          iVar5 = (pmVar9->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                  super_Fl_Group.super_Fl_Widget.x_;
          iVar6 = menuwindow::titlex(pmVar9,pp.item_number);
          menuwindow::menuwindow
                    (this_00,(Fl_Menu_Item *)0x0,iVar6 + iVar5,
                     (pmVar9->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                     super_Fl_Group.super_Fl_Widget.h_ +
                     (pmVar9->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                     super_Fl_Group.super_Fl_Widget.y_,0,0,(Fl_Menu_Item *)0x0,pFVar10,0,1,
                     in_stack_fffffffffffffd88);
          this_01 = (menuwindow *)this_00->title;
          pp.fakemenu = this_00;
          (*(this_01->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
            super_Fl_Widget._vptr_Fl_Widget[5])();
          bVar17 = false;
        }
      }
      else {
        if ((pFVar10->flags & 0x40U) == 0) {
          pFVar8 = (Fl_Menu_Item *)pFVar10->user_data_;
        }
        else {
          pFVar8 = pFVar10 + 1;
        }
        iVar5 = (pmVar9->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group
                .super_Fl_Widget.x_;
        if ((pp.menu_number == 0) && (pp.menubar != 0)) {
          iVar6 = menuwindow::titlex(pmVar9,pp.item_number);
          iVar12 = (pmVar9->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                   super_Fl_Group.super_Fl_Widget.h_ +
                   (pmVar9->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                   super_Fl_Group.super_Fl_Widget.y_;
          initial_item = (Fl_Menu_Item *)0x0;
        }
        else {
          iVar6 = (pmVar9->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                  super_Fl_Group.super_Fl_Widget.w_;
          iVar12 = pmVar9->itemheight * pp.item_number +
                   (pmVar9->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                   super_Fl_Group.super_Fl_Widget.y_;
          pFVar10 = (Fl_Menu_Item *)0x0;
        }
        iVar6 = iVar6 + iVar5;
        if (initial_item == (Fl_Menu_Item *)0x0) {
          if ((pp.menu_number + 1 < pp.nummenus) && (pp.p[(long)pp.menu_number + 1]->menu == pFVar8)
             ) {
            while (iVar5 = pp.nummenus, pp.menu_number + 2 < pp.nummenus) {
              pp.nummenus = pp.nummenus + -1;
              if (pp.p[(long)iVar5 + -1] != (menuwindow *)0x0) {
                (**(code **)((long)(pp.p[(long)iVar5 + -1]->super_Fl_Menu_Window).
                                   super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
                                   super_Fl_Widget._vptr_Fl_Widget + 8))();
              }
            }
            this_01 = pp.p[(long)pp.nummenus + -1];
            if (this_01->selected != -1) {
              this_01->selected = -1;
              Fl_Widget::damage((Fl_Widget *)this_01,'\x01');
            }
          }
          else {
            while (iVar5 = pp.nummenus, pp.menu_number + 1 < pp.nummenus) {
              pp.nummenus = pp.nummenus + -1;
              if (pp.p[(long)iVar5 + -1] != (menuwindow *)0x0) {
                (**(code **)((long)(pp.p[(long)iVar5 + -1]->super_Fl_Menu_Window).
                                   super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
                                   super_Fl_Widget._vptr_Fl_Widget + 8))();
              }
            }
            pmVar9 = (menuwindow *)operator_new(0x118);
            this_01 = pmVar9;
            menuwindow::menuwindow
                      (pmVar9,pFVar8,iVar6,iVar12,(uint)(pFVar10 != (Fl_Menu_Item *)0x0),0,
                       (Fl_Menu_Item *)0x0,pFVar10,0,menubar,in_stack_fffffffffffffd88);
            lVar13 = (long)pp.nummenus;
            pp.nummenus = pp.nummenus + 1;
            pp.p[lVar13] = pmVar9;
          }
LAB_001bfb7a:
          iVar6 = 0;
        }
        else {
          pmVar9 = (menuwindow *)operator_new(0x118);
          this_01 = pmVar9;
          menuwindow::menuwindow
                    (pmVar9,pFVar8,X,Y,W,H,initial_item,pFVar10,0,0,in_stack_fffffffffffffd88);
          lVar13 = (long)pp.nummenus;
          pp.nummenus = pp.nummenus + 1;
          pp.p[lVar13] = pmVar9;
          iVar5 = pmVar9->selected;
          if (iVar5 < 0) {
            iVar6 = 0;
          }
          else {
            iVar15 = (pmVar9->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                     super_Fl_Group.super_Fl_Widget.x_;
            iVar11 = (pmVar9->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                     super_Fl_Group.super_Fl_Widget.y_;
            this_01 = (menuwindow *)&waX;
            local_230 = initial_item;
            Fl::screen_work_area((int *)this_01,&waY,&waW,&waH,X,Y);
            if (-1 < pp.menu_number) {
              iVar11 = iVar11 - iVar12;
              iVar15 = iVar15 - iVar6;
              lVar13 = -1;
              do {
                iVar4 = waX;
                iVar3 = waY;
                this_01 = pp.p[lVar13 + 1];
                iVar6 = (this_01->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                        super_Fl_Group.super_Fl_Widget.x_;
                iVar12 = (this_01->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                         super_Fl_Group.super_Fl_Widget.y_;
                iVar14 = iVar6 + iVar15;
                X_00 = waX;
                if (waX < iVar14) {
                  X_00 = iVar14;
                }
                iVar16 = iVar12 + iVar11;
                Y_00 = waY;
                if (waY < iVar16) {
                  Y_00 = iVar16;
                }
                menuwindow::position(this_01,X_00,Y_00);
                if (iVar16 < iVar3) {
                  iVar11 = iVar3 - iVar12;
                }
                if (iVar14 < iVar4) {
                  iVar15 = iVar4 - iVar6;
                }
                lVar13 = lVar13 + 1;
              } while (lVar13 < pp.menu_number);
            }
            iVar12 = pp.nummenus;
            pmVar2 = ::p;
            iVar6 = pmVar9->selected;
            if (iVar6 < 0) {
              pFVar10 = (Fl_Menu_Item *)0x0;
            }
            else {
              this_01 = (menuwindow *)::p->p[(long)pp.nummenus + -1]->menu;
              pFVar10 = next((Fl_Menu_Item *)this_01,iVar6);
            }
            pmVar2->current_item = pFVar10;
            pmVar2->menu_number = iVar12 + -1;
            pmVar2->item_number = iVar6;
            iVar6 = 5;
            initial_item = local_230;
          }
          if (iVar5 < 0) goto LAB_001bfb7a;
        }
        bVar17 = iVar6 == 5;
      }
    }
    else {
      if (pmVar9->selected != -1) {
        pmVar9->selected = -1;
        Fl_Widget::damage((Fl_Widget *)pmVar9,'\x01');
        this_01 = pmVar9;
      }
      bVar17 = false;
      initial_item = (Fl_Menu_Item *)0x0;
    }
    if (!bVar17) {
LAB_001bf5ca:
      while( true ) {
        while( true ) {
          lVar13 = (long)menubar;
          if (menubar < pp.nummenus) {
            do {
              if ((pp.p[lVar13]->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.i ==
                  (Fl_X *)0x0) {
                pmVar1 = pp.p[lVar13]->title;
                if (pmVar1 != (menutitle *)0x0) {
                  (*(pmVar1->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                    super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
                }
                this_01 = pp.p[lVar13];
                (*(this_01->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                  super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 < pp.nummenus);
          }
          pFVar8 = pp.current_item;
          Fl::wait(this_01);
          pFVar10 = pp.current_item;
          iVar5 = 0;
          if (pp.current_item == pFVar8) {
            iVar5 = 7;
          }
          if (pp.state == 2) {
            iVar5 = 6;
          }
          if (iVar5 == 0) break;
          if (iVar5 != 7) {
            if (pp.fakemenu != (menuwindow *)0x0) {
              (*((pp.fakemenu)->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[1])();
            }
            while (1 < pp.nummenus) {
              pp.nummenus = pp.nummenus - 1;
              if (pp.p[(uint)pp.nummenus] != (menuwindow *)0x0) {
                (*(pp.p[(uint)pp.nummenus]->super_Fl_Menu_Window).super_Fl_Single_Window.
                  super_Fl_Window.super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[1])();
              }
            }
            Fl_Menu_Window::hide(&mw.super_Fl_Menu_Window);
            Fl::grab((Fl_Window *)0x0);
            goto LAB_001bf708;
          }
        }
        if (pp.fakemenu != (menuwindow *)0x0) {
          (*((pp.fakemenu)->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
            super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[1])();
          pp.fakemenu = (menuwindow *)0x0;
        }
        if (pp.current_item != (Fl_Menu_Item *)0x0) break;
        this_01 = pp.p[(long)pp.nummenus + -1];
        if (this_01->selected != -1) {
          this_01->selected = -1;
          Fl_Widget::damage((Fl_Widget *)this_01,'\x01');
        }
      }
      if (pp.fakemenu != (menuwindow *)0x0) {
        (*((pp.fakemenu)->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
          super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[1])();
        pp.fakemenu = (menuwindow *)0x0;
      }
      this_01 = pp.p[pp.menu_number];
      initial_item = (Fl_Menu_Item *)0x0;
      menuwindow::autoscroll(this_01,pp.item_number);
    }
  } while( true );
}

Assistant:

const Fl_Menu_Item* Fl_Menu_Item::pulldown(
    int X, int Y, int W, int H,
    const Fl_Menu_Item* initial_item,
    const Fl_Menu_* pbutton,
    const Fl_Menu_Item* t,
    int menubar) const {
  Fl_Group::current(0); // fix possible user error...

  button = pbutton;
  if (pbutton && pbutton->window()) {
    for (Fl_Window* w = pbutton->window(); w; w = w->window()) {
      X += w->x();
      Y += w->y();
    }
  } else {
    X += Fl::event_x_root()-Fl::event_x();
    Y += Fl::event_y_root()-Fl::event_y();
  }
  menuwindow mw(this, X, Y, W, H, initial_item, t, menubar);
  Fl::grab(mw);
  menustate pp; p = &pp;
  pp.p[0] = &mw;
  pp.nummenus = 1;
  pp.menubar = menubar;
  pp.state = INITIAL_STATE;
  pp.fakemenu = 0; // kludge for buttons in menubar

  // preselected item, pop up submenus if necessary:
  if (initial_item && mw.selected >= 0) {
    setitem(0, mw.selected);
    goto STARTUP;
  }

  pp.current_item = 0; pp.menu_number = 0; pp.item_number = -1;
  if (menubar) {
    // find the initial menu
    if (!mw.handle(FL_DRAG)) {
      Fl::grab(0);
      return 0;
    }
  }
  initial_item = pp.current_item;
  if (initial_item) goto STARTUP;

  // the main loop, runs until p.state goes to DONE_STATE:
  for (;;) {

    // make sure all the menus are shown:
    {
      for (int k = menubar; k < pp.nummenus; k++) {
        if (!pp.p[k]->shown()) {
	  if (pp.p[k]->title) pp.p[k]->title->show();
	  pp.p[k]->show();
        }
      }
    }

    // get events:
    {
      const Fl_Menu_Item* oldi = pp.current_item;
      Fl::wait();
      if (pp.state == DONE_STATE) break; // done.
      if (pp.current_item == oldi) continue;
    }

    // only do rest if item changes:
    if(pp.fakemenu) {delete pp.fakemenu; pp.fakemenu = 0;} // turn off "menubar button"

    if (!pp.current_item) { // pointing at nothing
      // turn off selection in deepest menu, but don't erase other menus:
      pp.p[pp.nummenus-1]->set_selected(-1);
      continue;
    }

    if(pp.fakemenu) {delete pp.fakemenu; pp.fakemenu = 0;}
    initial_item = 0; // stop the startup code
    pp.p[pp.menu_number]->autoscroll(pp.item_number);

  STARTUP:
    menuwindow& cw = *pp.p[pp.menu_number];
    const Fl_Menu_Item* m = pp.current_item;
    if (!m->activevisible()) { // pointing at inactive item
      cw.set_selected(-1);
      initial_item = 0; // turn off startup code
      continue;
    }
    cw.set_selected(pp.item_number);

    if (m==initial_item) initial_item=0; // stop the startup code if item found
    if (m->submenu()) {
      const Fl_Menu_Item* title = m;
      const Fl_Menu_Item* menutable;
      if (m->flags&FL_SUBMENU) menutable = m+1;
      else menutable = (Fl_Menu_Item*)(m)->user_data_;
      // figure out where new menu goes:
      int nX, nY;
      if (!pp.menu_number && pp.menubar) {	// menu off a menubar:
	nX = cw.x() + cw.titlex(pp.item_number);
	nY = cw.y() + cw.h();
	initial_item = 0;
      } else {
	nX = cw.x() + cw.w();
	nY = cw.y() + pp.item_number * cw.itemheight;
	title = 0;
      }
      if (initial_item) { // bring up submenu containing initial item:
	menuwindow* n = new menuwindow(menutable,X,Y,W,H,initial_item,title,0,0,cw.x());
	pp.p[pp.nummenus++] = n;
	// move all earlier menus to line up with this new one:
	if (n->selected>=0) {
	  int dy = n->y()-nY;
	  int dx = n->x()-nX;
	  int waX, waY, waW, waH;
	  Fl::screen_work_area(waX, waY, waW, waH, X, Y);
	  for (int menu = 0; menu <= pp.menu_number; menu++) {
	    menuwindow* tt = pp.p[menu];
	    int nx = tt->x()+dx; if (nx < waX) {nx = waX; dx = -tt->x() + waX;}
	    int ny = tt->y()+dy; if (ny < waY) {ny = waY; dy = -tt->y() + waY;}
	    tt->position(nx, ny);
	  }
	  setitem(pp.nummenus-1, n->selected);
	  goto STARTUP;
	}
      } else if (pp.nummenus > pp.menu_number+1 &&
		 pp.p[pp.menu_number+1]->menu == menutable) {
	// the menu is already up:
	while (pp.nummenus > pp.menu_number+2) delete pp.p[--pp.nummenus];
	pp.p[pp.nummenus-1]->set_selected(-1);
      } else {
	// delete all the old menus and create new one:
	while (pp.nummenus > pp.menu_number+1) delete pp.p[--pp.nummenus];
	pp.p[pp.nummenus++]= new menuwindow(menutable, nX, nY,
					  title?1:0, 0, 0, title, 0, menubar, 
					    (title ? 0 : cw.x()) );
      }
    } else { // !m->submenu():
      while (pp.nummenus > pp.menu_number+1) delete pp.p[--pp.nummenus];
      if (!pp.menu_number && pp.menubar) {
	// kludge so "menubar buttons" turn "on" by using menu title:
	pp.fakemenu = new menuwindow(0,
				  cw.x()+cw.titlex(pp.item_number),
				  cw.y()+cw.h(), 0, 0,
				  0, m, 0, 1);
	pp.fakemenu->title->show();
      }
    }
  }
  const Fl_Menu_Item* m = pp.current_item;
  delete pp.fakemenu;
  while (pp.nummenus>1) delete pp.p[--pp.nummenus];
  mw.hide();
  Fl::grab(0);
  return m;
}